

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_server::
set_http_handler<(cinatra::http_method)1,async_simple::coro::Lazy<void>(my_object::*)(cinatra::coro_http_request&,cinatra::coro_http_response&)>
          (coro_http_server *this,string *key,offset_in_my_object_to_subr handler,
          class_type_t<async_simple::coro::Lazy<void>_(my_object::*)(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
          *owner)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  *in_RDI;
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  f;
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  *__x;
  _Placeholder<1> *in_stack_ffffffffffffff18;
  offset_in_my_object_to_subr *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 local_70 [112];
  
  __x = (function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
         *)local_70;
  std::
  bind<async_simple::coro::Lazy<void>(my_object::*&)(cinatra::coro_http_request&,cinatra::coro_http_response&),my_object*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (in_stack_ffffffffffffff28,(my_object **)in_RDI,in_stack_ffffffffffffff18,
             (_Placeholder<2> *)in_RSI);
  std::
  function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>
  ::
  function<std::_Bind<async_simple::coro::Lazy<void>(my_object::*(my_object*,std::_Placeholder<1>,std::_Placeholder<2>))(cinatra::coro_http_request&,cinatra::coro_http_response&)>,void>
            (in_RDI,(_Bind<async_simple::coro::Lazy<void>_(my_object::*(my_object_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
                     *)(local_70 + 0x18));
  std::__cxx11::string::string
            (in_stack_ffffffffffffff30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff68);
  std::
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  ::function((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
              *)in_RSI,__x);
  set_http_handler<(cinatra::http_method)1,std::function<async_simple::coro::Lazy<void>(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
            ((coro_http_server *)in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  std::
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  ::~function((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
               *)0x4124ae);
  std::__cxx11::string::~string(in_RSI);
  std::
  function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  ::~function((function<async_simple::coro::Lazy<void>_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
               *)0x4124c5);
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler,
                        util::class_type_t<Func> &owner, Aspects &&...asps) {
    static_assert(std::is_member_function_pointer_v<Func>,
                  "must be member function");
    using return_type = typename util::function_traits<Func>::return_type;
    if constexpr (coro_io::is_lazy_v<return_type>) {
      std::function<async_simple::coro::Lazy<void>(coro_http_request & req,
                                                   coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
    else {
      std::function<void(coro_http_request & req, coro_http_response & resp)>
          f = std::bind(handler, &owner, std::placeholders::_1,
                        std::placeholders::_2);
      set_http_handler<method...>(std::move(key), std::move(f),
                                  std::forward<Aspects>(asps)...);
    }
  }